

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::EnableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64,
          string *aPSKd,string *aProvisioningUrl)

{
  string *aProvisioningUrl_local;
  string *aPSKd_local;
  uint64_t aEui64_local;
  JoinerType aType_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableJoiner(JoinerType         aType,
                                    uint64_t           aEui64,
                                    const std::string &aPSKd,
                                    const std::string &aProvisioningUrl)
{
    UNUSED(aType);
    UNUSED(aEui64);
    UNUSED(aPSKd);
    UNUSED(aProvisioningUrl);
    return Error{};
}